

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondPersistence.cpp
# Opt level: O2

void __thiscall OpenMD::HBondPersistence::computeFrame(HBondPersistence *this,int istep)

{
  pointer pvVar1;
  long lVar2;
  Molecule *pMVar3;
  Molecule *pMVar4;
  pointer ppHVar5;
  Atom *pAVar6;
  HBondDonor *pHVar7;
  pointer ppAVar8;
  double dVar9;
  int aInd;
  int hInd;
  int jj;
  int ii;
  Vector3d dPos;
  Vector3d DH;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d HA;
  Vector3d DA;
  Vector3d uDA;
  value_type_conflict2 local_148;
  int local_144;
  Molecule *local_140;
  Molecule *local_138;
  pointer local_130;
  double local_128;
  double local_120;
  double local_118;
  int local_110;
  int local_10c;
  SelectionManager *local_108;
  long local_100;
  SelectionSet local_f8;
  Vector<double,_3U> local_e0;
  SelectionManager *local_c8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&local_e0);
  Vector<double,_3U>::Vector(&local_90);
  Vector<double,_3U>::Vector(&local_a8);
  Vector<double,_3U>::Vector(&local_c0);
  Vector<double,_3U>::Vector(&local_60);
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_48);
  local_100 = (long)istep * 0x18;
  local_f8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            ((this->GIDtoDonor_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + istep,
             (long)((this->super_TimeCorrFunc<double>).info_)->nGlobalAtoms_,
             (value_type_conflict2 *)&local_f8);
  if ((this->super_TimeCorrFunc<double>).uniqueSelections_ == false) {
    SelectionManager::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_,
               &(this->super_TimeCorrFunc<double>).seleMan1_);
  }
  if ((this->super_TimeCorrFunc<double>).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_f8,&(this->super_TimeCorrFunc<double>).evaluator1_);
    SelectionManager::setSelectionSet(&(this->super_TimeCorrFunc<double>).seleMan1_,&local_f8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_f8.bitsets_);
  }
  if (((this->super_TimeCorrFunc<double>).uniqueSelections_ == true) &&
     ((this->super_TimeCorrFunc<double>).evaluator2_.isDynamic_ == true)) {
    SelectionEvaluator::evaluate(&local_f8,&(this->super_TimeCorrFunc<double>).evaluator2_);
    SelectionManager::setSelectionSet(&(this->super_TimeCorrFunc<double>).seleMan2_,&local_f8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_f8.bitsets_);
  }
  local_c8 = &(this->super_TimeCorrFunc<double>).seleMan1_;
  pMVar3 = SelectionManager::beginSelectedMolecule(local_c8,&local_10c);
  local_108 = &(this->super_TimeCorrFunc<double>).seleMan2_;
  while (pMVar3 != (Molecule *)0x0) {
    pMVar4 = SelectionManager::beginSelectedMolecule(local_108,&local_110);
    local_140 = pMVar3;
    while (pMVar4 != (Molecule *)0x0) {
      local_130 = (local_140->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_138 = pMVar4;
      if (local_130 ==
          (local_140->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pHVar7 = (HBondDonor *)0x0;
      }
      else {
        pHVar7 = *local_130;
      }
      while (pHVar7 != (HBondDonor *)0x0) {
        StuntDouble::getPos((Vector3d *)&local_f8,&pHVar7->donorAtom->super_StuntDouble);
        Vector<double,_3U>::operator=(&local_e0,(Vector<double,_3U> *)&local_f8);
        StuntDouble::getPos((Vector3d *)&local_f8,&pHVar7->donatedHydrogen->super_StuntDouble);
        Vector<double,_3U>::operator=(&local_a8,(Vector<double,_3U> *)&local_f8);
        operator-((Vector<double,_3U> *)&local_f8,&local_a8,&local_e0);
        Vector3<double>::operator=((Vector3<double> *)&local_c0,(Vector<double,_3U> *)&local_f8);
        Snapshot::wrapVector
                  ((this->super_TimeCorrFunc<double>).currentSnapshot_,(Vector3d *)&local_c0);
        local_128 = Vector<double,_3U>::length(&local_c0);
        local_144 = (pHVar7->donatedHydrogen->super_StuntDouble).globalIndex_;
        local_148 = -1;
        ppAVar8 = (local_138->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppAVar8 !=
            (local_138->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00139212;
        pAVar6 = (Atom *)0x0;
        while (pAVar6 != (Atom *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_f8,&pAVar6->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_90,(Vector<double,_3U> *)&local_f8);
          operator-((Vector<double,_3U> *)&local_f8,&local_90,&local_e0);
          Vector3<double>::operator=((Vector3<double> *)&local_60,(Vector<double,_3U> *)&local_f8);
          Snapshot::wrapVector
                    ((this->super_TimeCorrFunc<double>).currentSnapshot_,(Vector3d *)&local_60);
          dVar9 = Vector<double,_3U>::length(&local_60);
          if (dVar9 < this->OOCut_) {
            local_118 = dVar9;
            operator-((Vector<double,_3U> *)&local_f8,&local_90,&local_a8);
            Vector3<double>::operator=((Vector3<double> *)&local_78,(Vector<double,_3U> *)&local_f8)
            ;
            Snapshot::wrapVector
                      ((this->super_TimeCorrFunc<double>).currentSnapshot_,(Vector3d *)&local_78);
            local_120 = Vector<double,_3U>::length(&local_78);
            dVar9 = dot<double,3u>(&local_c0,&local_60);
            dVar9 = acos(dVar9 / (local_118 * local_128));
            lVar2 = local_100;
            if (((dVar9 * 180.0) / 3.141592653589793 < this->thetaCut_) &&
               (local_120 < this->OHCut_)) {
              local_148 = (pAVar6->super_StuntDouble).globalIndex_;
              pvVar1 = (this->acceptor_).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(int *)(*(long *)((long)&(((this->GIDtoDonor_).
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                        super__Vector_impl_data + local_100) + (long)local_144 * 4)
                   = (int)((ulong)(*(long *)((long)&(pvVar1->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data + local_100 + 8) -
                                  *(long *)((long)&(pvVar1->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data + local_100)) >> 2
                          );
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + local_100),&local_148);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(((this->DonorToGID_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + lVar2),&local_144);
            }
          }
          ppAVar8 = ppAVar8 + 1;
          pAVar6 = (Atom *)0x0;
          if (ppAVar8 !=
              (local_138->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_00139212:
            pAVar6 = *ppAVar8;
          }
        }
        local_130 = local_130 + 1;
        pHVar7 = (HBondDonor *)0x0;
        if (local_130 !=
            (local_140->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pHVar7 = *local_130;
        }
      }
      ppHVar5 = (local_138->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppHVar5 !=
          (local_138->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001394ae;
      pHVar7 = (HBondDonor *)0x0;
      while (pHVar7 != (HBondDonor *)0x0) {
        local_130 = ppHVar5;
        StuntDouble::getPos((Vector3d *)&local_f8,&pHVar7->donorAtom->super_StuntDouble);
        Vector<double,_3U>::operator=(&local_e0,(Vector<double,_3U> *)&local_f8);
        StuntDouble::getPos((Vector3d *)&local_f8,&pHVar7->donatedHydrogen->super_StuntDouble);
        Vector<double,_3U>::operator=(&local_a8,(Vector<double,_3U> *)&local_f8);
        operator-((Vector<double,_3U> *)&local_f8,&local_a8,&local_e0);
        Vector3<double>::operator=((Vector3<double> *)&local_c0,(Vector<double,_3U> *)&local_f8);
        Snapshot::wrapVector
                  ((this->super_TimeCorrFunc<double>).currentSnapshot_,(Vector3d *)&local_c0);
        local_128 = Vector<double,_3U>::length(&local_c0);
        local_144 = (pHVar7->donatedHydrogen->super_StuntDouble).globalIndex_;
        local_148 = -1;
        ppAVar8 = (local_140->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppAVar8 !=
            (local_140->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00139485;
        pAVar6 = (Atom *)0x0;
        while (pAVar6 != (Atom *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_f8,&pAVar6->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_90,(Vector<double,_3U> *)&local_f8);
          operator-((Vector<double,_3U> *)&local_f8,&local_90,&local_e0);
          Vector3<double>::operator=((Vector3<double> *)&local_60,(Vector<double,_3U> *)&local_f8);
          Snapshot::wrapVector
                    ((this->super_TimeCorrFunc<double>).currentSnapshot_,(Vector3d *)&local_60);
          dVar9 = Vector<double,_3U>::length(&local_60);
          if (dVar9 < this->OOCut_) {
            local_118 = dVar9;
            operator-((Vector<double,_3U> *)&local_f8,&local_90,&local_a8);
            Vector3<double>::operator=((Vector3<double> *)&local_78,(Vector<double,_3U> *)&local_f8)
            ;
            Snapshot::wrapVector
                      ((this->super_TimeCorrFunc<double>).currentSnapshot_,(Vector3d *)&local_78);
            local_120 = Vector<double,_3U>::length(&local_78);
            dVar9 = dot<double,3u>(&local_c0,&local_60);
            dVar9 = acos(dVar9 / (local_118 * local_128));
            lVar2 = local_100;
            if (((dVar9 * 180.0) / 3.141592653589793 < this->thetaCut_) &&
               (local_120 < this->OHCut_)) {
              local_148 = (pAVar6->super_StuntDouble).globalIndex_;
              pvVar1 = (this->acceptor_).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(int *)(*(long *)((long)&(((this->GIDtoDonor_).
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                        super__Vector_impl_data + local_100) + (long)local_144 * 4)
                   = (int)((ulong)(*(long *)((long)&(pvVar1->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data + local_100 + 8) -
                                  *(long *)((long)&(pvVar1->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data + local_100)) >> 2
                          );
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + local_100),&local_148);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(((this->DonorToGID_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + lVar2),&local_144);
            }
          }
          ppAVar8 = ppAVar8 + 1;
          pAVar6 = (Atom *)0x0;
          if (ppAVar8 !=
              (local_140->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_00139485:
            pAVar6 = *ppAVar8;
          }
        }
        ppHVar5 = local_130 + 1;
        pHVar7 = (HBondDonor *)0x0;
        if (ppHVar5 !=
            (local_138->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001394ae:
          pHVar7 = *ppHVar5;
        }
      }
      pMVar4 = SelectionManager::nextSelectedMolecule(local_108,&local_110);
    }
    pMVar3 = SelectionManager::nextSelectedMolecule(local_c8,&local_10c);
  }
  return;
}

Assistant:

void HBondPersistence::computeFrame(int istep) {
    Molecule* mol1;
    Molecule* mol2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    Vector3d HA;
    Vector3d uDA;
    RealType DAdist, DHdist, HAdist, theta, ctheta;
    int ii, jj;
    int hInd, aInd, index;

    // Map of atomic global IDs to donor atoms:
    GIDtoDonor_[istep].resize(info_->getNGlobalAtoms(), -1);

    if (!uniqueSelections_) { seleMan2_ = seleMan1_; }

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    if (uniqueSelections_ && evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
         mol1 = seleMan1_.nextSelectedMolecule(ii)) {
      for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
           mol2 = seleMan2_.nextSelectedMolecule(jj)) {
        // loop over the possible donors in molecule 1:
        for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol1->nextHBondDonor(hbdi)) {
          dPos = hbd->donorAtom->getPos();
          hPos = hbd->donatedHydrogen->getPos();
          DH   = hPos - dPos;
          currentSnapshot_->wrapVector(DH);
          DHdist = DH.length();

          hInd = hbd->donatedHydrogen->getGlobalIndex();
          aInd = -1;

          // loop over the possible acceptors in molecule 2:
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();
            DA   = aPos - dPos;
            currentSnapshot_->wrapVector(DA);
            DAdist = DA.length();

            // Distance criteria: are the donor and acceptor atoms
            // close enough?
            if (DAdist < OOCut_) {
              HA = aPos - hPos;
              currentSnapshot_->wrapVector(HA);
              HAdist = HA.length();

              ctheta = dot(DH, DA) / (DHdist * DAdist);
              theta  = acos(ctheta) * 180.0 / Constants::PI;

              // Angle criteria: are the D-H and D-A and vectors close?
              if (theta < thetaCut_ && HAdist < OHCut_) {
                // molecule 2 is a Hbond acceptor:
                aInd = hba->getGlobalIndex();

                index                    = acceptor_[istep].size();
                GIDtoDonor_[istep][hInd] = index;

                acceptor_[istep].push_back(aInd);
                DonorToGID_[istep].push_back(hInd);
              }
            }
          }
        }

        // loop over the possible donors in molecule 2:
        for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol2->nextHBondDonor(hbdi)) {
          dPos = hbd->donorAtom->getPos();
          hPos = hbd->donatedHydrogen->getPos();
          DH   = hPos - dPos;
          currentSnapshot_->wrapVector(DH);
          DHdist = DH.length();

          hInd = hbd->donatedHydrogen->getGlobalIndex();
          aInd = -1;

          // loop over the possible acceptors in molecule 1:
          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();
            DA   = aPos - dPos;
            currentSnapshot_->wrapVector(DA);
            DAdist = DA.length();

            // Distance criteria: are the donor and acceptor atoms
            // close enough?
            if (DAdist < OOCut_) {
              HA = aPos - hPos;
              currentSnapshot_->wrapVector(HA);
              HAdist = HA.length();

              ctheta = dot(DH, DA) / (DHdist * DAdist);
              theta  = acos(ctheta) * 180.0 / Constants::PI;

              // Angle criteria: are the D-H and D-A and vectors close?
              if (theta < thetaCut_ && HAdist < OHCut_) {
                // molecule 1 is a Hbond acceptor:
                aInd                     = hba->getGlobalIndex();
                index                    = acceptor_[istep].size();
                GIDtoDonor_[istep][hInd] = index;

                acceptor_[istep].push_back(aInd);
                DonorToGID_[istep].push_back(hInd);
              }
            }
          }
        }
      }
    }
  }